

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugutils.cpp
# Opt level: O2

void DebugUtils::dumpToConsole(LEFCellInfo_t *cell)

{
  ostream *poVar1;
  ostream *poVar2;
  char *pcVar3;
  string local_1c0;
  stringstream ss;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = local_190;
  std::operator<<(poVar2,"\n");
  if (cell == (LEFCellInfo_t *)0x0) {
    pcVar3 = "Error: cell is a nullptr!\n";
  }
  else {
    poVar1 = std::operator<<(poVar2,"Name:    ");
    poVar1 = std::operator<<(poVar1,(cell->m_name)._M_dataplus._M_p);
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar2,"Foreign  ");
    poVar1 = std::operator<<(poVar1,(cell->m_foreign)._M_dataplus._M_p);
    std::operator<<(poVar1,"\n");
    std::operator<<(poVar2,"Width    ");
    poVar1 = std::ostream::_M_insert<double>(cell->m_sx);
    std::operator<<(poVar1,"\n");
    std::operator<<(poVar2,"Height   ");
    poVar1 = std::ostream::_M_insert<double>(cell->m_sy);
    std::operator<<(poVar1,"\n");
    poVar1 = std::operator<<(poVar2,"Type     ");
    pcVar3 = "REGULAR";
    if (cell->m_isFiller != false) {
      pcVar3 = "FILLER";
    }
    poVar1 = std::operator<<(poVar1,pcVar3);
    pcVar3 = "\n";
    std::operator<<(poVar1,"\n");
    poVar2 = std::operator<<(poVar2,"Symmetry ");
    poVar2 = std::operator<<(poVar2,(cell->m_symmetry)._M_dataplus._M_p);
  }
  std::operator<<(poVar2,pcVar3);
  std::__cxx11::stringbuf::str();
  doLog(3,&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

void DebugUtils::dumpToConsole(const PRLEFReader::LEFCellInfo_t *cell)
{
    std::stringstream ss;
    ss << "\n";

    if (cell != nullptr)
    {
        ss << "Name:    " << cell->m_name.c_str() << "\n";
        ss << "Foreign  " << cell->m_foreign.c_str() << "\n";
        ss << "Width    " << cell->m_sx << "\n";
        ss << "Height   " << cell->m_sy << "\n";
        ss << "Type     " << (cell->m_isFiller ? "FILLER" : "REGULAR") << "\n";
        ss << "Symmetry " << cell->m_symmetry.c_str() << "\n";
    }
    else
    {
        ss << "Error: cell is a nullptr!\n";
    }
    doLog(LOG_INFO, ss.str());
}